

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O3

bool __thiscall
ktxApp::loadFileList
          (ktxApp *this,string *f,bool relativize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  FILE *__stream;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  bool bVar8;
  string listName;
  string dirname;
  string readFilename;
  long *local_10c8 [2];
  long local_10b8 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  value_type local_1080;
  ktxApp *local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  long *local_1038 [2];
  long local_1028 [511];
  
  local_10c8[0] = local_10b8;
  pcVar1 = (f->_M_dataplus)._M_p;
  local_10a8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)filenames;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_10c8,pcVar1,pcVar1 + f->_M_string_length);
  std::__cxx11::string::erase((ulong)local_10c8,0);
  local_1038[0] = local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"r","");
  __stream = fopen((char *)local_10c8[0],(char *)local_1038[0]);
  if (local_1038[0] != local_1028) {
    operator_delete(local_1038[0],local_1028[0] + 1);
  }
  plVar2 = local_10c8[0];
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    pcVar5 = strerror(*piVar7);
    bVar8 = false;
    error(this,"failed opening filename list: \"%s\": %s\n",plVar2,pcVar5);
    goto LAB_001075e2;
  }
  local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
  local_10a0._M_string_length = 0;
  local_10a0.field_2._M_local_buf[0] = '\0';
  local_1060 = this;
  if (relativize) {
    lVar4 = std::__cxx11::string::rfind((char)local_10c8,0x2f);
    if (lVar4 == -1) goto LAB_001073ee;
    std::__cxx11::string::substr((ulong)local_1038,(ulong)local_10c8);
    std::__cxx11::string::operator=((string *)&local_10a0,(string *)local_1038);
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0],local_1028[0] + 1);
    }
    bVar8 = true;
  }
  else {
LAB_001073ee:
    bVar8 = false;
  }
  local_1038[0] = (long *)((ulong)local_1038[0] & 0xffffffffffffff00);
  pcVar5 = fgets((char *)local_1038,0x1000,__stream);
  if (pcVar5 != (char *)0x0) {
    do {
      local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,pcVar5,pcVar5 + sVar6);
      while ((local_1080._M_string_length != 0 && (*local_1080._M_dataplus._M_p == ' '))) {
        std::__cxx11::string::erase((ulong)&local_1080,0);
      }
      while (local_1080._M_string_length != 0) {
        if ((0x20 < (ulong)(byte)local_1080._M_dataplus._M_p[local_1080._M_string_length - 1]) ||
           ((0x100002400U >>
             ((ulong)(byte)local_1080._M_dataplus._M_p[local_1080._M_string_length - 1] & 0x3f) & 1)
            == 0)) {
          if (bVar8) {
            std::operator+(&local_1058,&local_10a0,&local_1080);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_10a8,&local_1058);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
              operator_delete(local_1058._M_dataplus._M_p,
                              local_1058.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_10a8,&local_1080);
          }
          break;
        }
        std::__cxx11::string::erase((ulong)&local_1080,local_1080._M_string_length - 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
        operator_delete(local_1080._M_dataplus._M_p,local_1080.field_2._M_allocated_capacity + 1);
      }
      local_1038[0] = (long *)((ulong)local_1038[0] & 0xffffffffffffff00);
      pcVar5 = fgets((char *)local_1038,0x1000,__stream);
    } while (pcVar5 != (char *)0x0);
  }
  iVar3 = ferror(__stream);
  plVar2 = local_10c8[0];
  bVar8 = iVar3 == 0;
  if (bVar8) {
    fclose(__stream);
  }
  else {
    piVar7 = __errno_location();
    pcVar5 = strerror(*piVar7);
    error(local_1060,"failed reading filename list: \"%s\": %s\n",plVar2,pcVar5);
    fclose(__stream);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
    operator_delete(local_10a0._M_dataplus._M_p,
                    CONCAT71(local_10a0.field_2._M_allocated_capacity._1_7_,
                             local_10a0.field_2._M_local_buf[0]) + 1);
  }
LAB_001075e2:
  if (local_10c8[0] != local_10b8) {
    operator_delete(local_10c8[0],local_10b8[0] + 1);
  }
  return bVar8;
}

Assistant:

bool loadFileList(const string &f, bool relativize,
                      vector<string>& filenames)
    {
        string listName(f);
        listName.erase(0, relativize ? 2 : 1);

        FILE *lf = nullptr;
        lf = fopenUTF8(listName, "r");
        if (!lf) {
            error("failed opening filename list: \"%s\": %s\n",
                  listName.c_str(), strerror(errno));
            return false;
        }

        string dirname;

        if (relativize) {
            size_t dirnameEnd = listName.find_last_of('/');
            if (dirnameEnd == string::npos) {
                relativize = false;
            } else {
                dirname = listName.substr(0, dirnameEnd + 1);
            }
        }

        for (;;) {
            // Cross platform PATH_MAX def is too much trouble!
            char buf[4096];
            buf[0] = '\0';

            char *p = fgets(buf, sizeof(buf), lf);
            if (!p) {
              if (ferror(lf)) {
                error("failed reading filename list: \"%s\": %s\n",
                      listName.c_str(), strerror(errno));
                fclose(lf);
                return false;
              } else
                break;
            }

            string readFilename(p);
            while (readFilename.size()) {
                if (readFilename[0] == ' ')
                  readFilename.erase(0, 1);
                else
                  break;
            }

            while (readFilename.size()) {
                const char c = readFilename.back();
                if ((c == ' ') || (c == '\n') || (c == '\r'))
                  readFilename.erase(readFilename.size() - 1, 1);
                else
                  break;
            }

            if (readFilename.size()) {
                if (relativize)
                    filenames.push_back(dirname + readFilename);
                else
                    filenames.push_back(readFilename);
            }
        }

        fclose(lf);

        return true;
    }